

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O2

void __thiscall depspawn::internal::TaskPool::launch_threads(TaskPool *this)

{
  if (this->finish_ == true) {
    LOCK();
    (this->busy_threads_).super___atomic_base<int>._M_i = (this->thread_pool_).nthreads_in_use_;
    UNLOCK();
    this->finish_ = false;
    ThreadPool::launch_theads(&this->thread_pool_);
    return;
  }
  return;
}

Assistant:

void launch_threads()
  {
    if(finish_) {
      busy_threads_.store(thread_pool_.nthreads());
      finish_ = false;
      thread_pool_.launch_theads();
    }
  }